

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tag_scalar_vector.hpp
# Opt level: O3

void __thiscall
cfgfile::
tag_scalar_vector_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfgfile::string_trait_t>
::on_finish(tag_scalar_vector_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfgfile::string_trait_t>
            *this,parser_info_t<cfgfile::string_trait_t> *info)

{
  undefined8 *puVar1;
  tag_t<cfgfile::string_trait_t> *this_00;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  exception_t<cfgfile::string_trait_t> *this_01;
  pos_t pos;
  undefined8 *puVar4;
  undefined1 *local_290;
  long local_288;
  undefined1 local_280 [16];
  undefined1 *local_270;
  long local_268;
  undefined1 local_260 [16];
  undefined1 *local_250;
  long local_248;
  undefined1 local_240 [16];
  undefined1 *local_230;
  long local_228;
  undefined1 local_220 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  undefined1 *local_1b0;
  long local_1a8;
  undefined1 local_1a0 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  string_t local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  iVar3 = (*(this->super_tag_t<cfgfile::string_trait_t>)._vptr_tag_t[2])();
  puVar4 = *(undefined8 **)CONCAT44(extraout_var,iVar3);
  puVar1 = (undefined8 *)((undefined8 *)CONCAT44(extraout_var,iVar3))[1];
  do {
    if (puVar4 == puVar1) {
      return;
    }
    this_00 = (tag_t<cfgfile::string_trait_t> *)*puVar4;
    if (this_00->m_is_mandatory == true) {
      bVar2 = tag_t<cfgfile::string_trait_t>::is_defined(this_00);
      if (!bVar2) {
        this_01 = (exception_t<cfgfile::string_trait_t> *)__cxa_allocate_exception(0x30);
        local_290 = local_280;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_290,"Undefined child mandatory tag: \"","");
        local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_170,local_290,local_290 + local_288);
        std::operator+(&local_130,&local_170,&this_00->m_name);
        local_1b0 = local_1a0;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_1b0,"\". Where parent is: \"","");
        local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_190,local_1b0,local_1b0 + local_1a8);
        std::operator+(&local_110,&local_130,&local_190);
        std::operator+(&local_f0,&local_110,&(this->super_tag_t<cfgfile::string_trait_t>).m_name);
        local_230 = local_220;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"\". In file \"","");
        local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1d0,local_230,local_230 + local_228);
        std::operator+(&local_d0,&local_f0,&local_1d0);
        std::operator+(&local_b0,&local_d0,&info->m_file_name);
        local_250 = local_240;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_250,"\" on line ","");
        local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1f0,local_250,local_250 + local_248);
        std::operator+(&local_90,&local_b0,&local_1f0);
        string_trait_t::to_string_abi_cxx11_(&local_150,(string_trait_t *)info->m_line_number,pos);
        std::operator+(&local_70,&local_90,&local_150);
        local_270 = local_260;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_270,".","");
        local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_210,local_270,local_270 + local_268);
        std::operator+(&local_50,&local_70,&local_210);
        exception_t<cfgfile::string_trait_t>::exception_t(this_01,&local_50);
        __cxa_throw(this_01,&exception_t<cfgfile::string_trait_t>::typeinfo,
                    exception_t<cfgfile::string_trait_t>::~exception_t);
      }
    }
    puVar4 = puVar4 + 1;
  } while( true );
}

Assistant:

void on_finish( const parser_info_t< Trait > & info ) override
	{
		for( const tag_t< Trait > * tag : this->children() )
		{
			if( tag->is_mandatory() && !tag->is_defined() )
				throw exception_t< Trait >(
					Trait::from_ascii( "Undefined child mandatory tag: \"" ) +
					tag->name() +
					Trait::from_ascii( "\". Where parent is: \"" ) +
					this->name() + Trait::from_ascii( "\". In file \"" ) +
					info.file_name() + Trait::from_ascii( "\" on line " ) +
					Trait::to_string( info.line_number() ) +
					Trait::from_ascii( "." ) );
		}
	}